

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_stream::
read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  vector<char> *this_00;
  pointer pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  bool bVar2;
  error_category *peVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  string *this_01;
  char in_R8B;
  long lVar7;
  uint ev;
  size_t sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view last;
  string_view last_00;
  string_view last_01;
  string_view last_02;
  string_view last_03;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  error_code ec;
  size_t local_f8;
  char *local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  error_code invalid_response;
  mutable_buffer local_98;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_88;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_68;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_48;
  
  bVar2 = aux::proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                    (&this->super_proxy_base,e,h);
  if (bVar2) {
    return;
  }
  this_00 = &this->m_buffer;
  pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pcVar1;
  lVar7 = lVar6 << 0x20;
  lVar4 = lVar7 + -0x100000000 >> 0x20;
  if (pcVar1[lVar4] != '\n') {
    aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>::resize<int,void>
              ((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)this_00,
               (int)lVar6 + 1);
    invalid_response._0_8_ =
         (this->m_buffer).super_vector<char,_std::allocator<char>_>.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
         (lVar7 >> 0x20);
    invalid_response.cat_ = (error_category *)0x1;
    local_d8.second._M_str =
         (char *)(h->_M_bound_args).
                 super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
    local_d8.first._M_str = (char *)h->_M_f;
    local_d8.second._M_len = *(size_t *)&h->field_0x8;
    local_d8.first._M_len = (size_t)this;
    boost::asio::
    async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
              ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                *)this,(mutable_buffer *)&invalid_response,
               (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:227:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                *)&local_d8,(type *)0x0);
    return;
  }
  pcVar1[lVar4] = '\0';
  if (this->m_command == cmd_incoming) {
    ::std::__cxx11::string::assign((char *)&this->m_dest);
    ::std::
    _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
    ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                  *)h,e);
    local_d8.first._M_len =
         (size_t)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
    local_d8.first._M_str =
         (this->m_buffer).super_vector<char,_std::allocator<char>_>.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish;
    local_d8.second._M_len =
         (size_t)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
    (this_00->super_vector<char,_std::allocator<char>_>).
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (this->m_buffer).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (this->m_buffer).super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    goto LAB_002b1d71;
  }
  peVar3 = i2p_category();
  invalid_response.val_ = 1;
  bVar2 = boost::system::detail::failed_impl(1,peVar3);
  invalid_response.failed_ = bVar2;
  switch(this->m_state) {
  case read_hello_response:
    local_f0 = "REPLY";
    pcVar5 = "HELLO";
    sVar8 = 5;
    goto LAB_002b1e64;
  case read_connect_response:
  case read_accept_response:
    pcVar5 = "STREAM";
    sVar8 = 6;
    local_f0 = "STATUS";
LAB_002b1e64:
    bVar2 = false;
    local_f8 = sVar8;
    break;
  case read_session_create_response:
    sVar8 = 7;
    pcVar5 = "SESSION";
    local_f8 = 6;
    bVar2 = false;
    local_f0 = "STATUS";
    break;
  case read_name_lookup_response:
    local_f0 = "REPLY";
    sVar8 = 6;
    local_f8 = 5;
    pcVar5 = "NAMING";
    bVar2 = false;
    break;
  default:
    local_f0 = (char *)0x0;
    bVar2 = true;
    local_f8 = 0;
    pcVar5 = (char *)0x0;
    sVar8 = 0;
  }
  pcVar1 = (this->m_buffer).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  last._M_str = (char *)0x20;
  last._M_len = (size_t)pcVar1;
  invalid_response.cat_ = peVar3;
  aux::split_string(&local_d8,
                    (aux *)((this->m_buffer).super_vector<char,_std::allocator<char>_>.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + ~(ulong)pcVar1),last,in_R8B);
  bVar9._M_str = local_d8.first._M_str;
  bVar9._M_len = local_d8.first._M_len;
  local_e8._M_len = local_d8.second._M_len;
  local_e8._M_str = local_d8.second._M_str;
  ec._0_8_ = CONCAT44(ec._4_4_,ec.val_);
  if (!bVar2) {
    __x_00._M_str = pcVar5;
    __x_00._M_len = sVar8;
    bVar2 = ::std::operator!=(__x_00,bVar9);
    ec._0_8_ = CONCAT44(ec._4_4_,ec.val_);
    if (!bVar2) {
      last_00._M_str = (char *)0x20;
      last_00._M_len = (size_t)local_e8._M_str;
      aux::split_string(&local_d8,(aux *)local_e8._M_len,last_00,in_R8B);
      __y_07._M_str = local_d8.first._M_str;
      __y_07._M_len = local_d8.first._M_len;
      local_e8._M_len = local_d8.second._M_len;
      local_e8._M_str = local_d8.second._M_str;
      __x._M_str = local_f0;
      __x._M_len = local_f8;
      bVar2 = ::std::operator!=(__x,__y_07);
      if (!bVar2) {
        ev = 0;
LAB_002b1f71:
        while( true ) {
          last_01._M_str = (char *)0x3d;
          last_01._M_len = (size_t)local_e8._M_str;
          aux::split_string(&local_d8,(aux *)local_e8._M_len,last_01,in_R8B);
          __y_10._M_str = local_d8.first._M_str;
          __y_10._M_len = local_d8.first._M_len;
          __y_09._M_str = local_d8.first._M_str;
          __y_09._M_len = local_d8.first._M_len;
          __y_08._M_str = local_d8.first._M_str;
          __y_08._M_len = local_d8.first._M_len;
          local_e8._M_len = local_d8.second._M_len;
          local_e8._M_str = local_d8.second._M_str;
          if (local_d8.first._M_len == 0) break;
          ec.val_ = 0;
          ec.failed_ = false;
          ec._5_3_ = 0;
          ec.cat_ = (error_category *)0x0;
          if (*local_d8.second._M_str == '\"') {
            bVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_e8,1,0xffffffffffffffff);
            last_02._M_len = bVar9._M_str;
            last_02._M_str = (char *)0x22;
            aux::split_string(&local_d8,(aux *)bVar9._M_len,last_02,in_R8B);
            local_e8._M_len = local_d8.second._M_len;
            local_e8._M_str = local_d8.second._M_str;
            ec._0_8_ = local_d8.first._M_len;
            if (local_d8.first._M_len == 0) goto LAB_002b1f2f;
            ec._0_8_ = local_d8.first._M_len - 1;
          }
          else {
            last_03._M_str = (char *)0x20;
            last_03._M_len = (size_t)local_d8.second._M_str;
            aux::split_string(&local_d8,(aux *)local_d8.second._M_len,last_03,in_R8B);
            ec._0_8_ = local_d8.first._M_len;
          }
          local_e8._M_len = local_d8.second._M_len;
          local_e8._M_str = local_d8.second._M_str;
          if (ec._0_8_ == 0) goto LAB_002b1f2f;
          __x_01._M_str = "RESULT";
          __x_01._M_len = 6;
          ec.cat_ = (error_category *)local_d8.first._M_str;
          bVar2 = ::std::operator==(__x_01,__y_08);
          if (!bVar2) {
            __x_10._M_str = "VALUE";
            __x_10._M_len = 5;
            bVar2 = ::std::operator==(__x_10,__y_09);
            this_01 = (string *)&this->m_name_lookup;
            if (!bVar2) goto LAB_002b218b;
            goto LAB_002b21ad;
          }
          __y._M_str = (char *)ec.cat_;
          __y._M_len._0_4_ = ec.val_;
          __y._M_len._4_1_ = ec.failed_;
          __y._M_len._5_3_ = ec._5_3_;
          __x_02._M_str = "OK";
          __x_02._M_len = 2;
          bVar2 = ::std::operator==(__x_02,__y);
          ev = 0;
          if (!bVar2) {
            __y_00._M_str = (char *)ec.cat_;
            __y_00._M_len._0_4_ = ec.val_;
            __y_00._M_len._4_1_ = ec.failed_;
            __y_00._M_len._5_3_ = ec._5_3_;
            __x_03._M_str = "CANT_REACH_PEER";
            __x_03._M_len = 0xf;
            bVar2 = ::std::operator==(__x_03,__y_00);
            ev = 2;
            if (!bVar2) {
              __y_01._M_str = (char *)ec.cat_;
              __y_01._M_len._0_4_ = ec.val_;
              __y_01._M_len._4_1_ = ec.failed_;
              __y_01._M_len._5_3_ = ec._5_3_;
              __x_04._M_str = "I2P_ERROR";
              __x_04._M_len = 9;
              bVar2 = ::std::operator==(__x_04,__y_01);
              ev = 3;
              if (!bVar2) {
                __y_02._M_str = (char *)ec.cat_;
                __y_02._M_len._0_4_ = ec.val_;
                __y_02._M_len._4_1_ = ec.failed_;
                __y_02._M_len._5_3_ = ec._5_3_;
                __x_05._M_str = "INVALID_KEY";
                __x_05._M_len = 0xb;
                bVar2 = ::std::operator==(__x_05,__y_02);
                ev = 4;
                if (!bVar2) {
                  __y_03._M_str = (char *)ec.cat_;
                  __y_03._M_len._0_4_ = ec.val_;
                  __y_03._M_len._4_1_ = ec.failed_;
                  __y_03._M_len._5_3_ = ec._5_3_;
                  __x_06._M_str = "INVALID_ID";
                  __x_06._M_len = 10;
                  bVar2 = ::std::operator==(__x_06,__y_03);
                  ev = 5;
                  if (!bVar2) {
                    __y_04._M_str = (char *)ec.cat_;
                    __y_04._M_len._0_4_ = ec.val_;
                    __y_04._M_len._4_1_ = ec.failed_;
                    __y_04._M_len._5_3_ = ec._5_3_;
                    __x_07._M_str = "TIMEOUT";
                    __x_07._M_len = 7;
                    bVar2 = ::std::operator==(__x_07,__y_04);
                    ev = 6;
                    if (!bVar2) {
                      __y_05._M_str = (char *)ec.cat_;
                      __y_05._M_len._0_4_ = ec.val_;
                      __y_05._M_len._4_1_ = ec.failed_;
                      __y_05._M_len._5_3_ = ec._5_3_;
                      __x_08._M_str = "KEY_NOT_FOUND";
                      __x_08._M_len = 0xd;
                      bVar2 = ::std::operator==(__x_08,__y_05);
                      ev = 7;
                      if (!bVar2) {
                        __y_06._M_str = (char *)ec.cat_;
                        __y_06._M_len._0_4_ = ec.val_;
                        __y_06._M_len._4_1_ = ec.failed_;
                        __y_06._M_len._5_3_ = ec._5_3_;
                        __x_09._M_str = "DUPLICATED_ID";
                        __x_09._M_len = 0xd;
                        bVar2 = ::std::operator==(__x_09,__y_06);
                        ev = bVar2 ^ 9;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        peVar3 = i2p_category();
        ec.val_ = ev;
        bVar2 = boost::system::detail::failed_impl(ev,peVar3);
        ec.failed_ = bVar2;
        ec.cat_ = peVar3;
        if (bVar2) {
          ::std::
          _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
          ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                        *)h,&ec);
          return;
        }
        switch(this->m_state) {
        case read_hello_response:
          switch(this->m_command) {
          case cmd_none:
          case cmd_name_lookup:
          case cmd_incoming:
            goto switchD_002b2212_caseD_1;
          case cmd_create_session:
            local_48._M_f = h->_M_f;
            local_48._8_8_ = *(undefined8 *)&h->field_0x8;
            local_48._M_bound_args.
            super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
            super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
                 (h->_M_bound_args).
                 super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
            send_session_create<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                      (this,&local_48);
            return;
          case cmd_connect:
            local_88._M_f = h->_M_f;
            local_88._8_8_ = *(undefined8 *)&h->field_0x8;
            local_88._M_bound_args.
            super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
            super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
                 (h->_M_bound_args).
                 super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
            send_connect<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                      (this,&local_88);
            return;
          case cmd_accept:
            local_68._M_f = h->_M_f;
            local_68._8_8_ = *(undefined8 *)&h->field_0x8;
            local_68._M_bound_args.
            super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
            super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
                 (h->_M_bound_args).
                 super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
            send_accept<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                      (this,&local_68);
            return;
          default:
            return;
          }
        case read_connect_response:
        case read_session_create_response:
        case read_name_lookup_response:
switchD_002b2212_caseD_1:
          ::std::
          _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
          ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                        *)h,&ec);
          local_d8.first._M_len =
               (size_t)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_d8.first._M_str =
               (this->m_buffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          local_d8.second._M_len =
               (size_t)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          (this_00->super_vector<char,_std::allocator<char>_>).
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x0;
          (this->m_buffer).super_vector<char,_std::allocator<char>_>.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = (pointer)0x0;
          (this->m_buffer).super_vector<char,_std::allocator<char>_>.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          break;
        case read_accept_response:
          this->m_command = cmd_incoming;
          ::std::vector<char,_std::allocator<char>_>::resize
                    (&this_00->super_vector<char,_std::allocator<char>_>,1);
          local_98.data_ =
               (this->m_buffer).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
          local_98.size_ =
               (long)(this->m_buffer).super_vector<char,_std::allocator<char>_>.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish - (long)local_98.data_;
          if (local_98.size_ == 0) {
            local_98.data_ = (pointer)0x0;
          }
          local_d8.second._M_str =
               (char *)(h->_M_bound_args).
                       super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>
                       .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl;
          local_d8.first._M_str = (char *)h->_M_f;
          local_d8.second._M_len = *(size_t *)&h->field_0x8;
          local_d8.first._M_len = (size_t)this;
          boost::asio::
          async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::read_line<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_2_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                    ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                      *)this,&local_98,
                     (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:383:5),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                      *)&local_d8,(type *)0x0);
          return;
        default:
          return;
        }
LAB_002b1d71:
        ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_d8);
        return;
      }
    }
  }
LAB_002b1f2f:
  aux::proxy_base::
  handle_error<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
            (&this->super_proxy_base,&invalid_response,h);
  return;
LAB_002b218b:
  __x_11._M_str = "DESTINATION";
  __x_11._M_len = 0xb;
  bVar2 = ::std::operator==(__x_11,__y_10);
  this_01 = (string *)&this->m_dest;
  if (bVar2) {
LAB_002b21ad:
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              (this_01,(basic_string_view<char,_std::char_traits<char>_> *)&ec);
  }
  goto LAB_002b1f71;
}

Assistant:

void read_line(error_code const& e, Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		COMPLETE_ASYNC("i2p_stream::read_line");
		if (handle_error(e, h)) return;

		auto const read_pos = int(m_buffer.size());

		// look for \n which means end of the response
		if (m_buffer[read_pos - 1] != '\n')
		{
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			// read another byte from the socket
			m_buffer.resize(read_pos + 1);
			async_read(m_sock, boost::asio::buffer(&m_buffer[read_pos], 1), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				read_line(ec, std::move(hn));
			}, std::move(h)));
			return;
		}
		m_buffer[read_pos - 1] = 0;

		if (m_command == cmd_incoming)
		{
			// this is the line containing the destination
			// of the incoming connection in an accept call
			m_dest = &m_buffer[0];
			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		error_code invalid_response(i2p_error::parse_failed
			, i2p_category());

		string_view expect1;
		string_view expect2;

		switch (m_state)
		{
			case read_hello_response:
				expect1 = "HELLO"_sv;
				expect2 = "REPLY"_sv;
				break;
			case read_connect_response:
			case read_accept_response:
				expect1 = "STREAM"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_session_create_response:
				expect1 = "SESSION"_sv;
				expect2 = "STATUS"_sv;
				break;
			case read_name_lookup_response:
				expect1 = "NAMING"_sv;
				expect2 = "REPLY"_sv;
				break;
		}

		TORRENT_ASSERT(m_buffer[int(m_buffer.size()) - 1] == '\0');
		string_view remaining(m_buffer.data(), m_buffer.size() - 1);
		string_view token;

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect1.empty() || expect1 != token)
		{ handle_error(invalid_response, h); return; }

		std::tie(token, remaining) = aux::split_string(remaining, ' ');
		if (expect2.empty() || expect2 != token)
		{ handle_error(invalid_response, h); return; }

		int result = 0;

		for(;;)
		{
			string_view name;
			std::tie(name, remaining) = aux::split_string(remaining, '=');
			if (name.empty()) break;
			string_view value;
			if (remaining[0] == '"')
			{
				std::tie(value, remaining) = aux::split_string(remaining.substr(1), '"');
				if (value.empty()) { handle_error(invalid_response, h); return; }
				value.remove_suffix(1);
			}
			else
			{
				std::tie(value, remaining) = aux::split_string(remaining, ' ');
			}
			if (value.empty()) { handle_error(invalid_response, h); return; }

			if ("RESULT"_sv == name)
			{
				if ("OK"_sv == value)
					result = i2p_error::no_error;
				else if ("CANT_REACH_PEER"_sv == value)
					result = i2p_error::cant_reach_peer;
				else if ("I2P_ERROR"_sv == value)
					result = i2p_error::i2p_error;
				else if ("INVALID_KEY"_sv == value)
					result = i2p_error::invalid_key;
				else if ("INVALID_ID"_sv == value)
					result = i2p_error::invalid_id;
				else if ("TIMEOUT"_sv == value)
					result = i2p_error::timeout;
				else if ("KEY_NOT_FOUND"_sv == value)
					result = i2p_error::key_not_found;
				else if ("DUPLICATED_ID"_sv == value)
					result = i2p_error::duplicated_id;
				else
					result = i2p_error::num_errors; // unknown error
			}
			/*else if ("MESSAGE" == name)
			{
			}
			else if ("VERSION"_sv == name)
			{
			}*/
			else if ("VALUE"_sv == name)
			{
				m_name_lookup = value;
			}
			else if ("DESTINATION"_sv == name)
			{
				m_dest = value;
			}
		}

		error_code ec(result, i2p_category());
		if (ec)
		{
			std::forward<Handler>(h)(ec);
			return;
		}

		switch (m_state)
		{
		case read_hello_response:
			switch (m_command)
			{
				case cmd_create_session:
					send_session_create(std::move(h));
					break;
				case cmd_accept:
					send_accept(std::move(h));
					break;
				case cmd_connect:
					send_connect(std::move(h));
					break;
				case cmd_none:
				case cmd_name_lookup:
				case cmd_incoming:
					std::forward<Handler>(h)(ec);
					std::vector<char>().swap(m_buffer);
			}
			break;
		case read_connect_response:
		case read_session_create_response:
		case read_name_lookup_response:
			std::forward<Handler>(h)(ec);
			std::vector<char>().swap(m_buffer);
			break;
		case read_accept_response:
			// the SAM bridge is waiting for an incoming
			// connection.
			// wait for one more line containing
			// the destination of the remote peer
			m_command = cmd_incoming;
			m_buffer.resize(1);
			ADD_OUTSTANDING_ASYNC("i2p_stream::read_line");
			async_read(m_sock, boost::asio::buffer(m_buffer), aux::wrap_allocator(
				[this](error_code const& err, std::size_t, Handler hn) {
					read_line(err, std::move(hn));
				}, std::move(h)));
			break;
		}
	}